

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseBlockItems
          (Parser *this,TokenKind endKind,Token *end,bool inConstructor)

{
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  enable_if_t<is_constructible_v<decay_t<const_DiagCode_&>,_const_slang::DiagCode_&>,_optional<decay_t<const_DiagCode_&>_>_>
  eVar5;
  EmptyStatementSyntax *pEVar6;
  SyntaxNode *pSVar7;
  undefined4 extraout_var;
  Token *in_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  TokenKind in_SI;
  undefined8 *in_RDI;
  bool bVar8;
  AttrList AVar9;
  AttrList AVar10;
  Token TVar11;
  Token TVar12;
  Parser *in_stack_000000c0;
  AttrList in_stack_000000c8;
  bool isStmt;
  SyntaxNode *newNode;
  SourceLocation loc;
  bool erroredAboutDecls;
  bool sawStatement;
  bool errored;
  TokenKind kind;
  SmallVector<slang::syntax::SyntaxNode_*,_16UL> buffer;
  undefined1 in_stack_00000856;
  undefined1 in_stack_00000857;
  Parser *in_stack_00000858;
  ParserBase *in_stack_fffffffffffffd18;
  SmallVectorBase<slang::syntax::SyntaxNode_*> *in_stack_fffffffffffffd20;
  ParserBase *in_stack_fffffffffffffd40;
  SourceLocation in_stack_fffffffffffffd80;
  Info *in_stack_fffffffffffffd88;
  undefined2 local_270;
  undefined1 uStack_26e;
  undefined1 uStack_26d;
  DiagCode code;
  undefined1 uVar13;
  TokenKind in_stack_fffffffffffffdae;
  ParserBase *in_stack_fffffffffffffdb0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  Parser *in_stack_fffffffffffffe50;
  pointer in_stack_fffffffffffffe58;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe60;
  TokenKind local_198;
  _Storage<slang::DiagCode,_true> local_166;
  undefined2 local_162;
  _Storage<slang::DiagCode,_true> local_160;
  undefined2 local_15c;
  _Storage<slang::DiagCode,_true> local_156;
  undefined2 local_152;
  Token local_150;
  SourceLocation local_140;
  AttrList local_138;
  AttrList local_128;
  byte local_111;
  ParserBase *local_110;
  Token local_108;
  SourceLocation local_f8;
  byte local_ef;
  byte local_ee;
  byte local_ed;
  Token local_e0;
  TokenKind local_ca;
  char in_stack_ffffffffffffff50 [8];
  
  SmallVector<slang::syntax::SyntaxNode_*,_16UL>::SmallVector
            ((SmallVector<slang::syntax::SyntaxNode_*,_16UL> *)0x8f8dba);
  local_e0 = ParserBase::peek(in_stack_fffffffffffffd18);
  uVar2 = _local_270;
  AVar9._M_extent._M_extent_value = in_stack_fffffffffffffde8._M_extent_value;
  AVar9._M_ptr = in_stack_fffffffffffffdf0;
  TVar12.info = in_stack_fffffffffffffd88;
  uStack_26e = (undefined1)((ulong)_local_270 >> 0x10);
  uStack_26d = (undefined1)((ulong)uVar2 >> 0x18);
  code = SUB84((ulong)uVar2 >> 0x20,0);
  TVar12.kind = local_270;
  TVar12._2_1_ = uStack_26e;
  TVar12.numFlags.raw = uStack_26d;
  TVar12.rawLen = (uint32_t)code;
  local_ca = local_e0.kind;
  local_ed = 0;
  local_ee = 0;
  local_ef = 0;
  while( true ) {
    bVar3 = slang::syntax::SyntaxFacts::isEndKeyword(local_ca);
    bVar8 = false;
    if ((!bVar3) && (bVar8 = false, local_ca != in_SI)) {
      bVar8 = local_ca != EndOfFile;
    }
    if (!bVar8) break;
    TVar11 = ParserBase::peek(in_stack_fffffffffffffd18);
    local_108 = TVar11;
    local_f8 = Token::location(&local_108);
    local_110 = (ParserBase *)0x0;
    local_111 = 0;
    bVar8 = isPortDeclaration((Parser *)TVar12.info,in_stack_fffffffffffffd80._7_1_);
    if (bVar8) {
      AVar9 = parseAttributes((Parser *)in_stack_ffffffffffffff50);
      AVar10._M_extent._M_extent_value = in_stack_fffffffffffffe60._M_extent_value;
      AVar10._M_ptr = in_stack_fffffffffffffe58;
      local_128 = AVar9;
      local_110 = (ParserBase *)parsePortDeclaration(in_stack_fffffffffffffe50,AVar10);
    }
    else {
      bVar8 = isVariableDeclaration((Parser *)AVar9._M_extent._M_extent_value._M_extent_value);
      if (bVar8) {
        AVar10 = parseAttributes((Parser *)in_stack_ffffffffffffff50);
        local_138 = AVar10;
        local_110 = (ParserBase *)parseVariableDeclaration(in_stack_000000c0,in_stack_000000c8);
      }
      else {
        bVar8 = slang::syntax::SyntaxFacts::isPossibleStatement(local_ca);
        if (bVar8) {
          in_stack_fffffffffffffdb0 =
               (ParserBase *)
               parseStatement(in_stack_00000858,(bool)in_stack_00000857,(bool)in_stack_00000856);
          in_stack_fffffffffffffdae = in_stack_fffffffffffffdae & RealTimeKeyword;
          local_110 = in_stack_fffffffffffffdb0;
          if ((((MemberSyntax *)&in_stack_fffffffffffffdb0->alloc)->super_SyntaxNode).kind ==
              EmptyStatement) {
            pEVar6 = slang::syntax::SyntaxNode::as<slang::syntax::EmptyStatementSyntax>
                               ((SyntaxNode *)in_stack_fffffffffffffdb0);
            bVar8 = Token::isMissing(&pEVar6->semicolon);
            in_stack_fffffffffffffdae = in_stack_fffffffffffffdae & RealTimeKeyword;
            if (bVar8) {
              TVar12 = ParserBase::peek(in_stack_fffffffffffffd18);
              uVar13 = (undefined1)in_stack_fffffffffffffdae;
              local_150 = TVar12;
              in_stack_fffffffffffffd80 = Token::location(&local_150);
              local_140 = in_stack_fffffffffffffd80;
              bVar8 = SourceLocation::operator==(&local_f8,&local_140);
              in_stack_fffffffffffffdae = CONCAT11(bVar8,uVar13);
            }
          }
          if ((char)(in_stack_fffffffffffffdae >> 8) != '\0') {
            std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_156);
            local_15c = local_152;
            local_160 = local_156;
            ParserBase::skipToken
                      ((ParserBase *)AVar9._M_extent._M_extent_value._M_extent_value,
                       (_Optional_base<slang::DiagCode,_true,_true>)AVar9._M_ptr._2_6_);
          }
          local_111 = 1;
          local_ee = 1;
        }
        else {
          if ((local_ed & 1) == 0) {
            eVar5 = std::make_optional<slang::DiagCode_const&>
                              ((DiagCode *)in_stack_fffffffffffffd18);
            local_166 = eVar5.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::DiagCode>._M_payload;
            local_162 = eVar5.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::DiagCode>._4_2_;
          }
          else {
            std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_166);
          }
          ParserBase::skipToken
                    ((ParserBase *)AVar9._M_extent._M_extent_value._M_extent_value,
                     (_Optional_base<slang::DiagCode,_true,_true>)AVar9._M_ptr._2_6_);
          local_ed = 1;
        }
      }
    }
    if (local_110 != (ParserBase *)0x0) {
      pSVar7 = std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                         ((SyntaxNode **)in_stack_fffffffffffffd20,&in_stack_fffffffffffffd18->alloc
                         );
      (local_110->window).buffer = (Token *)pSVar7;
      SmallVectorBase<slang::syntax::SyntaxNode_*>::push_back
                (in_stack_fffffffffffffd20,(SyntaxNode **)in_stack_fffffffffffffd18);
      local_ed = 0;
      if ((((local_ef & 1) == 0) && ((local_111 & 1) == 0)) && ((local_ee & 1) != 0)) {
        code = (DiagCode)TVar12.rawLen;
        ParserBase::addDiag((ParserBase *)in_stack_fffffffffffffd80,code,(SourceLocation)TVar12.info
                           );
        local_ef = 1;
      }
    }
    TVar11 = ParserBase::peek(in_stack_fffffffffffffd18);
    local_198 = TVar11.kind;
    local_ca = local_198;
  }
  if (in_SI == JoinKeyword) {
    if ((ushort)(local_ca - JoinKeyword) < 3) {
      TVar11 = ParserBase::consume(in_stack_fffffffffffffd40);
      *in_RDX = TVar11;
    }
    else {
      TVar12 = ParserBase::expect(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
      TVar11.info = TVar12.info;
      TVar11._0_8_ = in_stack_fffffffffffffe58;
      *in_RDX = TVar12;
    }
  }
  else {
    TVar12 = ParserBase::expect(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
    TVar11.info = TVar12.info;
    TVar11._0_8_ = in_stack_fffffffffffffe58;
    *in_RDX = TVar12;
  }
  iVar4 = SmallVectorBase<slang::syntax::SyntaxNode_*>::copy
                    ((SmallVectorBase<slang::syntax::SyntaxNode_*> *)&stack0xffffffffffffff38,
                     (EVP_PKEY_CTX *)*in_RDI,(EVP_PKEY_CTX *)TVar11.info);
  sVar1._M_ptr._4_4_ = extraout_var;
  sVar1._M_ptr._0_4_ = iVar4;
  SmallVector<slang::syntax::SyntaxNode_*,_16UL>::~SmallVector
            ((SmallVector<slang::syntax::SyntaxNode_*,_16UL> *)0x8f9563);
  sVar1._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar1;
}

Assistant:

std::span<SyntaxNode*> Parser::parseBlockItems(TokenKind endKind, Token& end, bool inConstructor) {
    SmallVector<SyntaxNode*, 16> buffer;
    auto kind = peek().kind;
    bool errored = false;
    bool sawStatement = false;
    bool erroredAboutDecls = false;

    while (!isEndKeyword(kind) && kind != endKind && kind != TokenKind::EndOfFile) {
        SourceLocation loc = peek().location();
        SyntaxNode* newNode = nullptr;
        bool isStmt = false;

        if (isPortDeclaration(/* inStatement */ true)) {
            newNode = &parsePortDeclaration(parseAttributes());
        }
        else if (isVariableDeclaration()) {
            newNode = &parseVariableDeclaration(parseAttributes());
        }
        else if (isPossibleStatement(kind)) {
            newNode = &parseStatement(/* allowEmpty */ true,
                                      /* allowSuperNew */ inConstructor && !sawStatement);
            if (newNode->kind == SyntaxKind::EmptyStatement &&
                newNode->as<EmptyStatementSyntax>().semicolon.isMissing() &&
                loc == peek().location()) {
                skipToken(std::nullopt);
            }
            isStmt = true;
            sawStatement = true;
        }
        else {
            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedStatement));
            errored = true;
        }

        if (newNode) {
            newNode->previewNode = std::exchange(previewNode, nullptr);
            buffer.push_back(newNode);
            errored = false;

            if (!erroredAboutDecls && !isStmt && sawStatement) {
                addDiag(diag::DeclarationsAtStart, loc);
                erroredAboutDecls = true;
            }
        }
        kind = peek().kind;
    }

    // parallel blocks can end in one of three join keywords
    if (endKind == TokenKind::JoinKeyword) {
        switch (kind) {
            case TokenKind::JoinKeyword:
            case TokenKind::JoinAnyKeyword:
            case TokenKind::JoinNoneKeyword:
                end = consume();
                break;
            default:
                end = expect(endKind);
                break;
        }
    }
    else {
        end = expect(endKind);
    }

    return buffer.copy(alloc);
}